

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::NormalGetFullPath
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,bool implib,
          bool realname)

{
  bool bVar1;
  string local_50;
  
  GetDirectory(__return_storage_ptr__,this,config,implib);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  bVar1 = IsAppBundleOnApple(this);
  if (bVar1) {
    BuildMacContentDirectory(&local_50,this,__return_storage_ptr__,config,false);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (implib) {
    GetFullName(&local_50,this,config,true);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else if (realname) {
    NormalGetRealName(&local_50,this,config);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    GetFullName(&local_50,this,config,false);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetFullPath(const std::string& config,
                                                 bool implib,
                                                 bool realname) const
{
  std::string fpath = this->GetDirectory(config, implib);
  fpath += "/";
  if(this->IsAppBundleOnApple())
    {
    fpath = this->BuildMacContentDirectory(fpath, config, false);
    fpath += "/";
    }

  // Add the full name of the target.
  if(implib)
    {
    fpath += this->GetFullName(config, true);
    }
  else if(realname)
    {
    fpath += this->NormalGetRealName(config);
    }
  else
    {
    fpath += this->GetFullName(config, false);
    }
  return fpath;
}